

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void auto_compaction_snapshots_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  int r;
  int i;
  char str [64];
  int num_compactions;
  fdb_doc *rdoc;
  fdb_kvs_info info;
  fdb_seqnum_t seqnum;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_status status;
  fdb_kvs_handle *snapshot;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffca8;
  fdb_kvs_handle *handle;
  fdb_file_handle *in_stack_fffffffffffffcb0;
  fdb_doc **in_stack_fffffffffffffcb8;
  void *in_stack_fffffffffffffcc0;
  fdb_doc **in_stack_fffffffffffffcc8;
  void *value;
  fdb_doc **keylen;
  void *in_stack_fffffffffffffce0;
  fdb_kvs_handle *in_stack_fffffffffffffce8;
  undefined1 local_308 [248];
  int local_210;
  uint local_20c;
  fdb_doc *local_208 [3];
  fdb_kvs_info *in_stack_fffffffffffffe10;
  fdb_kvs_handle *in_stack_fffffffffffffe18;
  fdb_doc *local_1c0;
  fdb_seqnum_t local_1b0;
  undefined1 local_168 [32];
  undefined1 local_148;
  undefined1 local_13a;
  fdb_config *in_stack_fffffffffffffec8;
  fdb_file_handle **in_stack_fffffffffffffed8;
  fdb_seqnum_t in_stack_ffffffffffffff50;
  fdb_kvs_handle **in_stack_ffffffffffffff58;
  fdb_kvs_handle *in_stack_ffffffffffffff60;
  fdb_kvs_handle *local_68;
  void *local_60;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  local_210 = system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_168,local_308,0xf8);
  local_13a = 1;
  local_148 = 1;
  fVar1 = fdb_open(in_stack_fffffffffffffed8,(char *)0x1,in_stack_fffffffffffffec8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x129b);
    auto_compaction_snapshots_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x129b,"void auto_compaction_snapshots_test()");
    }
  }
  fdb_get_default_kvs_config();
  fVar1 = fdb_kvs_open_default
                    (in_stack_fffffffffffffcb0,(fdb_kvs_handle **)in_stack_fffffffffffffca8,
                     (fdb_kvs_config *)0x11f948);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x12a0);
    auto_compaction_snapshots_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x12a0,"void auto_compaction_snapshots_test()");
    }
  }
  local_20c = 0;
  do {
    if (99999 < (int)local_20c) {
      fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffffca8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12d2);
        auto_compaction_snapshots_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x12d2,"void auto_compaction_snapshots_test()");
        }
      }
      fVar1 = fdb_shutdown();
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12d4);
        auto_compaction_snapshots_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x12d4,"void auto_compaction_snapshots_test()");
        }
      }
      memleak_end();
      sprintf((char *)local_208,"auto compaction completed %d times with snapshots",0);
      if (auto_compaction_snapshots_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n",local_208);
      }
      else {
        fprintf(_stderr,"%s PASSED\n",local_208);
      }
      return;
    }
    sprintf((char *)local_208,"%d",(ulong)local_20c);
    keylen = local_208;
    value = local_60;
    strlen((char *)local_208);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,(size_t)keylen,value,
                       (size_t)in_stack_fffffffffffffcc8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x12a6);
      auto_compaction_snapshots_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12a6,"void auto_compaction_snapshots_test()");
      }
    }
    if (((int)local_20c % 10 == 0) &&
       (fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffca8,'\0'),
       fVar1 != FDB_RESULT_SUCCESS)) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x12ab);
      auto_compaction_snapshots_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12ab,"void auto_compaction_snapshots_test()");
      }
    }
    if ((int)local_20c % 100 == 0) {
      fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12b1);
        auto_compaction_snapshots_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x12b1,"void auto_compaction_snapshots_test()");
        }
      }
      fVar1 = fdb_snapshot_open(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                in_stack_ffffffffffffff50);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12b5);
        auto_compaction_snapshots_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x12b5,"void auto_compaction_snapshots_test()");
        }
      }
      handle = (fdb_kvs_handle *)0x0;
      fdb_doc_create(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (size_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,0,(void *)0x11fc88,
                     (size_t)in_stack_fffffffffffffce0);
      local_1c0->seqnum = local_1b0;
      fVar1 = fdb_get_byseq(local_68,local_1c0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12ba);
        auto_compaction_snapshots_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x12ba,"void auto_compaction_snapshots_test()");
        }
      }
      in_stack_fffffffffffffcc0 = local_1c0->key;
      in_stack_fffffffffffffcc8 = local_208;
      sVar3 = strlen((char *)local_208);
      iVar2 = memcmp(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,sVar3);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_208,local_1c0->key,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12bb);
        auto_compaction_snapshots_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12bb,"void auto_compaction_snapshots_test()");
      }
      fdb_doc_free((fdb_doc *)0x11fdce);
      fVar1 = fdb_kvs_close(handle);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12bf);
        auto_compaction_snapshots_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x12bf,"void auto_compaction_snapshots_test()");
        }
      }
      fVar1 = fdb_snapshot_open(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                                in_stack_ffffffffffffff50);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12c3);
        auto_compaction_snapshots_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x12c3,"void auto_compaction_snapshots_test()");
        }
      }
      in_stack_fffffffffffffca8 = (fdb_kvs_handle *)0x0;
      fdb_doc_create(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (size_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,0,(void *)0x11fef5,
                     (size_t)in_stack_fffffffffffffce0);
      local_1c0->seqnum = local_1b0;
      fVar1 = fdb_get_byseq(local_68,local_1c0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12c8);
        auto_compaction_snapshots_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x12c8,"void auto_compaction_snapshots_test()");
        }
      }
      in_stack_fffffffffffffcb0 = (fdb_file_handle *)local_1c0->key;
      in_stack_fffffffffffffcb8 = local_208;
      sVar3 = strlen((char *)local_208);
      iVar2 = memcmp(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcb8,sVar3);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_208,local_1c0->key,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12c9);
        auto_compaction_snapshots_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x12c9,"void auto_compaction_snapshots_test()");
      }
      fdb_doc_free((fdb_doc *)0x12003b);
      fVar1 = fdb_kvs_close(in_stack_fffffffffffffca8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x12cd);
        auto_compaction_snapshots_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x12cd,"void auto_compaction_snapshots_test()");
        }
      }
    }
    local_20c = local_20c + 1;
  } while( true );
}

Assistant:

void auto_compaction_snapshots_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *file;
    fdb_kvs_handle *kvs, *snapshot;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_seqnum_t seqnum;
    fdb_kvs_info info;
    fdb_doc *rdoc;
    int num_compactions = 0;
    char str[64];

    int i, r;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // Open Database File
    config = fdb_get_default_config();
    config.compaction_mode = FDB_COMPACTION_AUTO;
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.compaction_cb = compaction_cb_count;
    config.compaction_cb_ctx = &num_compactions;
    config.compaction_cb_mask = FDB_CS_COMPLETE;
    config.compactor_sleep_duration=1;
    status = fdb_open(&file, "mvcc_test1", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Open KV Store
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Several kv pairs
    for(i=0;i<100000;i++) {
        sprintf(str, "%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Every 10 Commit
        if (i % 10 == 0) {
            status = fdb_commit(file, FDB_COMMIT_NORMAL);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }

        // Every 100 iterations Get Seq/Snapshot
        if (i % 100 == 0) {
            status = fdb_get_kvs_info(kvs, &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            seqnum = info.last_seqnum;
            // Open durable snapshot in the midst of compaction..
            status = fdb_snapshot_open(kvs, &snapshot, seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            // verify last doc set is captured in snapshot..
            fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
            rdoc->seqnum = seqnum;
            status = fdb_get_byseq(snapshot, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, str, strlen(str));
            // free result document
            fdb_doc_free(rdoc);
            status = fdb_kvs_close(snapshot);
            TEST_CHK(status == FDB_RESULT_SUCCESS);

            // Open in-memory snapshot and verify content
            status = fdb_snapshot_open(kvs, &snapshot, FDB_SNAPSHOT_INMEM);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            // verify last doc set is captured in snapshot..
            fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
            rdoc->seqnum = seqnum;
            status = fdb_get_byseq(snapshot, rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->key, str, strlen(str));
            // free result document
            fdb_doc_free(rdoc);
            status = fdb_kvs_close(snapshot);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    status = fdb_close(file);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();

    sprintf(str, "auto compaction completed %d times with snapshots",
            num_compactions);
    TEST_RESULT(str);
}